

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::str_format_internal::LengthModToString_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,LengthMod v)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "h";
    __a = &local_9;
    break;
  case 1:
    __s = "hh";
    __a = &local_a;
    break;
  case 2:
    __s = "l";
    __a = &local_b;
    break;
  case 3:
    __s = "ll";
    __a = &local_c;
    break;
  case 4:
    __s = "L";
    __a = &local_d;
    break;
  case 5:
    __s = "j";
    __a = &local_e;
    break;
  case 6:
    __s = "z";
    __a = &local_f;
    break;
  case 7:
    __s = "t";
    __a = &local_10;
    break;
  case 8:
    __s = "q";
    __a = &local_11;
    break;
  case 9:
    __s = "";
    __a = &local_12;
    break;
  default:
    __s = "";
    __a = &local_13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string LengthModToString(LengthMod v) {
  switch (v) {
    case LengthMod::h:
      return "h";
    case LengthMod::hh:
      return "hh";
    case LengthMod::l:
      return "l";
    case LengthMod::ll:
      return "ll";
    case LengthMod::L:
      return "L";
    case LengthMod::j:
      return "j";
    case LengthMod::z:
      return "z";
    case LengthMod::t:
      return "t";
    case LengthMod::q:
      return "q";
    case LengthMod::none:
      return "";
  }
  return "";
}